

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsChartElement.cpp
# Opt level: O2

void __thiscall KDReports::ChartElement::ChartElement(ChartElement *this,QString *modelKey)

{
  ChartElementPrivate *pCVar1;
  QAbstractItemModel *pQVar2;
  
  Element::Element(&this->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ChartElement_00170178;
  pCVar1 = (ChartElementPrivate *)operator_new(0x28);
  (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pCVar1->m_tableModel = (QAbstractItemModel *)0x0;
  (pCVar1->m_size).wd = 100.0;
  (pCVar1->m_size).ht = 100.0;
  pCVar1->m_unit = Millimeters;
  pCVar1->m_deleteChart = false;
  (this->d).d = pCVar1;
  LOCK();
  (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pCVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((modelKey->d).size != 0) {
    pQVar2 = modelForKey(modelKey);
    pCVar1 = QSharedDataPointer<KDReports::ChartElementPrivate>::operator->(&this->d);
    pCVar1->m_tableModel = pQVar2;
  }
  return;
}

Assistant:

KDReports::ChartElement::ChartElement(const QString &modelKey)
    : d(new ChartElementPrivate)
{
    if (!modelKey.isEmpty())
        d->m_tableModel = KDReports::modelForKey(modelKey);
}